

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerConnection.cxx
# Opt level: O2

bool __thiscall cmStdIoConnection::OnServeStart(cmStdIoConnection *this,string *pString)

{
  cmServerBase *pcVar1;
  uv_stream_t *stream;
  bool bVar2;
  uv_handle_type uVar3;
  ssize_t sVar4;
  uv_prepare_t *handle;
  uv_loop_t *loop;
  undefined1 *local_448 [2];
  undefined1 local_438 [16];
  char buffer [1024];
  
  pcVar1 = (this->super_cmEventBasedConnection).super_cmConnection.Server;
  (*pcVar1->_vptr_cmServerBase[4])(pcVar1,this);
  stream = (this->super_cmEventBasedConnection).ReadStream;
  if (stream == (uv_stream_t *)0x0) {
    uVar3 = uv_guess_handle(0);
    if (uVar3 == UV_FILE) {
      while( true ) {
        sVar4 = read(0,buffer,0x400);
        if (sVar4 == 0) break;
        local_448[0] = local_438;
        std::__cxx11::string::_M_construct<char*>((string *)local_448,buffer,buffer + sVar4);
        (*(this->super_cmEventBasedConnection).super_cmConnection._vptr_cmConnection[9])
                  (this,local_448);
        std::__cxx11::string::~string((string *)local_448);
      }
      handle = (uv_prepare_t *)operator_new(0x78);
      handle->data = (void *)0x0;
      handle->loop = (uv_loop_t *)0x0;
      *(undefined8 *)&handle->type = 0;
      handle->close_cb = (uv_close_cb)0x0;
      handle->handle_queue[0] = (void *)0x0;
      handle->handle_queue[1] = (void *)0x0;
      (handle->u).reserved[0] = (void *)0x0;
      (handle->u).reserved[1] = (void *)0x0;
      (handle->u).reserved[2] = (void *)0x0;
      (handle->u).reserved[3] = (void *)0x0;
      handle->queue[1] = (void *)0x0;
      handle->next_closing = (uv_handle_t *)0x0;
      *(undefined8 *)&handle->flags = 0;
      handle->prepare_cb = (uv_prepare_cb)0x0;
      handle->queue[0] = (void *)0x0;
      handle->data = this;
      loop = cmServerBase::GetLoop((this->super_cmEventBasedConnection).super_cmConnection.Server);
      uv_prepare_init(loop,handle);
      uv_prepare_start(handle,shutdown_connection);
    }
  }
  else {
    uv_read_start(stream,cmEventBasedConnection::on_alloc_buffer,cmEventBasedConnection::on_read);
  }
  bVar2 = cmConnection::OnServeStart((cmConnection *)this,pString);
  return bVar2;
}

Assistant:

bool cmStdIoConnection::OnServeStart(std::string* pString)
{
  Server->OnConnected(this);
  if (this->ReadStream) {
    uv_read_start(this->ReadStream, on_alloc_buffer, on_read);
  } else if (uv_guess_handle(0) == UV_FILE) {
    char buffer[1024];
    while (auto len = read(0, buffer, sizeof(buffer))) {
      ReadData(std::string(buffer, buffer + len));
    }

    // We can't start the disconnect from here, add a prepare hook to do that
    // for us
    auto prepare = new uv_prepare_t();
    prepare->data = this;
    uv_prepare_init(Server->GetLoop(), prepare);
    uv_prepare_start(prepare, shutdown_connection);
  }
  return cmConnection::OnServeStart(pString);
}